

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Functional::(anonymous_namespace)::ConstantShaderGenerator::next_abi_cxx11_
          (string *__return_storage_ptr__,void *this,ShaderType shaderType)

{
  ostream *poVar1;
  char *__s;
  float value;
  string outputName;
  string valueString;
  ostringstream out;
  float local_1cc;
  string local_1c8 [32];
  string local_1a8;
  ostream local_188;
  
  local_1cc = deRandom_getFloat((deRandom *)((long)this + 8));
  local_1cc = local_1cc + 0.0;
  de::toString<float>(&local_1a8,&local_1cc);
  __s = "o_fragColor";
  if (shaderType == SHADERTYPE_VERTEX) {
    __s = "gl_Position";
  }
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,__s,(allocator<char> *)&local_188);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  std::operator<<(&local_188,"#version 300 es\n");
  if (shaderType == SHADERTYPE_FRAGMENT) {
    std::operator<<(&local_188,"layout(location = 0) out mediump vec4 o_fragColor;\n");
  }
  std::operator<<(&local_188,"void main (void)\n");
  std::operator<<(&local_188,"{\n");
  poVar1 = std::operator<<(&local_188,"\t");
  poVar1 = std::operator<<(poVar1,local_1c8);
  poVar1 = std::operator<<(poVar1," = vec4(");
  poVar1 = std::operator<<(poVar1,(string *)&local_1a8);
  std::operator<<(poVar1,");\n");
  std::operator<<(&local_188,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string ConstantShaderGenerator::next (const glu::ShaderType shaderType)
{
	DE_ASSERT(shaderType == glu::SHADERTYPE_VERTEX || shaderType == glu::SHADERTYPE_FRAGMENT);

	const float			value		= m_rnd.getFloat(0.0f, 1.0f);
	const std::string	valueString	= de::toString(value);
	const std::string	outputName	= (shaderType == glu::SHADERTYPE_VERTEX) ? "gl_Position" : "o_fragColor";

	std::ostringstream	out;

	out << "#version 300 es\n";

	if (shaderType == glu::SHADERTYPE_FRAGMENT)
		out << "layout(location = 0) out mediump vec4 o_fragColor;\n";

	out << "void main (void)\n";
	out << "{\n";
	out << "	" << outputName << " = vec4(" << valueString << ");\n";
	out << "}\n";

	return out.str();
}